

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_export(mbedtls_rsa_context *ctx,mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,
                      mbedtls_mpi *D,mbedtls_mpi *E)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_cmp_int(&ctx->N,0);
  if (((((iVar1 == 0) || (iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0), iVar1 == 0)) ||
       (iVar1 = mbedtls_mpi_cmp_int(&ctx->Q,0), iVar1 == 0)) ||
      ((iVar1 = mbedtls_mpi_cmp_int(&ctx->D,0), iVar1 == 0 ||
       (iVar1 = mbedtls_mpi_cmp_int(&ctx->E,0), iVar1 == 0)))) &&
     ((P != (mbedtls_mpi *)0x0 || Q != (mbedtls_mpi *)0x0) || D != (mbedtls_mpi *)0x0)) {
    return -0x4080;
  }
  if ((N != (mbedtls_mpi *)0x0) && (iVar1 = mbedtls_mpi_copy(N,&ctx->N), iVar1 != 0)) {
    return iVar1;
  }
  if ((P != (mbedtls_mpi *)0x0) && (iVar1 = mbedtls_mpi_copy(P,&ctx->P), iVar1 != 0)) {
    return iVar1;
  }
  if ((Q != (mbedtls_mpi *)0x0) && (iVar1 = mbedtls_mpi_copy(Q,&ctx->Q), iVar1 != 0)) {
    return iVar1;
  }
  if ((D != (mbedtls_mpi *)0x0) && (iVar1 = mbedtls_mpi_copy(D,&ctx->D), iVar1 != 0)) {
    return iVar1;
  }
  if ((E != (mbedtls_mpi *)0x0) && (iVar1 = mbedtls_mpi_copy(E,&ctx->E), iVar1 != 0)) {
    return iVar1;
  }
  return 0;
}

Assistant:

int mbedtls_rsa_export(const mbedtls_rsa_context *ctx,
                       mbedtls_mpi *N, mbedtls_mpi *P, mbedtls_mpi *Q,
                       mbedtls_mpi *D, mbedtls_mpi *E)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int is_priv;

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int(&ctx->N, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->P, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->D, 0) != 0 &&
        mbedtls_mpi_cmp_int(&ctx->E, 0) != 0;

    if (!is_priv) {
        /* If we're trying to export private parameters for a public key,
         * something must be wrong. */
        if (P != NULL || Q != NULL || D != NULL) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

    }

    /* Export all requested core parameters. */

    if ((N != NULL && (ret = mbedtls_mpi_copy(N, &ctx->N)) != 0) ||
        (P != NULL && (ret = mbedtls_mpi_copy(P, &ctx->P)) != 0) ||
        (Q != NULL && (ret = mbedtls_mpi_copy(Q, &ctx->Q)) != 0) ||
        (D != NULL && (ret = mbedtls_mpi_copy(D, &ctx->D)) != 0) ||
        (E != NULL && (ret = mbedtls_mpi_copy(E, &ctx->E)) != 0)) {
        return ret;
    }

    return 0;
}